

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

int duckdb::DecimalToString::DecimalLength<int>(int value,uint8_t width,uint8_t scale)

{
  int iVar1;
  int iVar2;
  undefined3 in_register_00000011;
  int iVar3;
  uint32_t value_00;
  
  if (CONCAT31(in_register_00000011,scale) != 0) {
    iVar3 = ((uint)scale - (value >> 0x1f)) + (uint)(scale < width) + 1;
    iVar1 = NumericHelper::SignedLength<int,unsigned_int>(value);
    iVar2 = iVar1 + 1;
    if (iVar1 + 1 < iVar3) {
      iVar2 = iVar3;
    }
    return iVar2;
  }
  value_00 = value;
  if (value < 1) {
    value_00 = -value;
  }
  iVar2 = NumericHelper::UnsignedLength<unsigned_int>(value_00);
  return iVar2 - (value >> 0x1f);
}

Assistant:

static int DecimalLength(SIGNED value, uint8_t width, uint8_t scale) {
		using UNSIGNED = typename MakeUnsigned<SIGNED>::type;
		if (scale == 0) {
			// scale is 0: regular number
			return NumericHelper::SignedLength<SIGNED, UNSIGNED>(value);
		}
		// length is max of either:
		// scale + 2 OR
		// integer length + 1
		// scale + 2 happens when the number is in the range of (-1, 1)
		// in that case we print "0.XXX", which is the scale, plus "0." (2 chars)
		// integer length + 1 happens when the number is outside of that range
		// in that case we print the integer number, but with one extra character ('.')
		auto extra_characters = width > scale ? 2 : 1;
		return MaxValue(scale + extra_characters + (value < 0 ? 1 : 0),
		                NumericHelper::SignedLength<SIGNED, UNSIGNED>(value) + 1);
	}